

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

void __thiscall
soul::StructuralParser::giveErrorOnAssignmentToProcessorProperty(StructuralParser *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  Context context;
  Context local_90;
  CompileMessage local_78;
  CompileMessage local_40;
  
  local_90.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_90.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_90.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_90.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_90.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_90.parentScope = this->currentScope;
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2852bf);
  if (!bVar2) goto LAB_001e866c;
  pcVar1 = (this->super_SOULTokeniser).currentType.text;
  if (pcVar1 != ".") {
    if (pcVar1 == (char *)0x0) {
LAB_001e866c:
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_90.location.sourceCode.object);
      return;
    }
    iVar3 = strcmp(pcVar1,".");
    if (iVar3 != 0) goto LAB_001e866c;
  }
  parseProcessorProperty(this);
  pcVar1 = (this->super_SOULTokeniser).currentType.text;
  if (pcVar1 == "=") {
LAB_001e8697:
    CompileMessageHelpers::createMessage<>
              (&local_40,syntax,error,"Processor properties are constants, and cannot be modified");
    AST::Context::throwError(&local_90,&local_40,false);
  }
  if (pcVar1 != (char *)0x0) {
    iVar3 = strcmp(pcVar1,"=");
    if (iVar3 == 0) goto LAB_001e8697;
  }
  CompileMessageHelpers::createMessage<>(&local_78,syntax,error,"Expected a statement");
  AST::Context::throwError(&local_90,&local_78,false);
}

Assistant:

void giveErrorOnAssignmentToProcessorProperty()
    {
        auto context = getContext();

        if (matchIf (Keyword::processor) && matches (Operator::dot))
        {
            ignoreUnused (parseProcessorProperty());

            if (matches (Operator::assign))
                context.throwError (Errors::cannotAssignToProcessorProperties());

            context.throwError (Errors::expectedStatement());
        }
    }